

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::DragBehaviorT<unsigned_long_long,long_long,double>
               (ImGuiDataType data_type,unsigned_long_long *v,float v_speed,unsigned_long_long v_min
               ,unsigned_long_long v_max,char *format,float power,ImGuiDragFlags flags)

{
  bool bVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ImGuiContext *pIVar11;
  bool bVar12;
  uint uVar13;
  unsigned_long_long uVar14;
  uint uVar15;
  ImGuiDataType data_type_00;
  uint uVar16;
  long lVar17;
  bool bVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  double dVar22;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 in_ZMM2 [64];
  undefined4 in_XMM4_Da;
  undefined4 in_XMM4_Db;
  undefined8 in_XMM4_Qb;
  double local_90;
  undefined1 local_78 [16];
  undefined8 local_50;
  undefined1 local_48 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [56];
  
  pIVar11 = GImGui;
  uVar15 = data_type & 0xfffffffe;
  bVar18 = uVar15 != 8;
  bVar3 = v_max <= v_min;
  bVar4 = power == 1.0;
  if (v_max < v_min) {
    return false;
  }
  if (v_speed == 0.0 && (v_min <= v_max && v_max - v_min != 0)) {
    auVar21 = vcvtusi2ss_avx512f(in_ZMM2._0_16_,v_max - v_min);
    v_speed = auVar21._0_4_ * GImGui->DragSpeedDefaultRatio;
    in_XMM0_Db = 0;
    in_XMM0_Dc = 0;
    in_XMM0_Dd = 0;
  }
  uVar16 = flags & 1;
  local_78._4_4_ = in_XMM0_Db;
  local_78._0_4_ = v_speed;
  local_78._8_4_ = in_XMM0_Dc;
  local_78._12_4_ = in_XMM0_Dd;
  if (((GImGui->ActiveIdSource != ImGuiInputSource_Mouse) ||
      (bVar12 = IsMousePosValid((ImVec2 *)0x0), !bVar12)) ||
     ((pIVar11->IO).MouseDragMaxDistanceSqr[0] <= 1.0)) {
    fVar19 = 0.0;
    if (pIVar11->ActiveIdSource == ImGuiInputSource_Nav) {
      uVar13 = 0;
      if (uVar15 == 8) {
        uVar13 = ImParseFormatPrecision(format,3);
      }
      auVar23._0_8_ = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      auVar23._8_56_ = extraout_var_00;
      local_50 = vmovlps_avx(auVar23._0_16_);
      fVar19 = *(float *)(local_48 + (ulong)uVar16 * 4 + -8);
      if ((int)uVar13 < 0) {
        auVar21 = SUB6416(ZEXT464(0x800000),0);
      }
      else if ((int)uVar13 < 10) {
        auVar21 = ZEXT416(*(uint *)(GetMinimumStepAtDecimalPrecision(int)::min_steps +
                                   (ulong)uVar13 * 4));
      }
      else {
        local_48 = ZEXT416((uint)fVar19);
        auVar24._0_4_ = powf(10.0,(float)(int)-uVar13);
        auVar24._4_60_ = extraout_var;
        auVar21 = auVar24._0_16_;
        fVar19 = (float)local_48._0_4_;
      }
      uVar5 = vcmpss_avx512f(auVar21,local_78,2);
      bVar12 = (bool)((byte)uVar5 & 1);
      v_speed = (float)((uint)bVar12 * (int)v_speed + (uint)!bVar12 * auVar21._0_4_);
    }
  }
  else {
    fVar19 = (pIVar11->IO).NavInputs[(ulong)uVar16 + 0x1d];
    bVar12 = (pIVar11->IO).KeyShift;
    bVar1 = (pIVar11->IO).KeyAlt;
    fVar19 = (float)((uint)(bVar1 & 1) * (int)(fVar19 * 0.01) +
                    (uint)!(bool)(bVar1 & 1) * (int)fVar19);
    fVar19 = (float)((uint)(bVar12 & 1) * (int)(fVar19 * 10.0) +
                    (uint)!(bool)(bVar12 & 1) * (int)fVar19);
  }
  lVar17 = v_max - v_min;
  fVar19 = fVar19 * v_speed;
  auVar21._8_4_ = 0x80000000;
  auVar21._0_8_ = 0x8000000080000000;
  auVar21._12_4_ = 0x80000000;
  auVar21 = vxorps_avx512vl(ZEXT416((uint)fVar19),auVar21);
  fVar20 = (float)((uint)(uVar16 == 0) * (int)fVar19 + (uint)(uVar16 != 0) * auVar21._0_4_);
  uVar14 = v_max;
  if (v_max < v_min || lVar17 == 0) {
    bVar12 = false;
  }
  else {
    uVar2 = *v;
    if ((uVar2 < v_max) || (bVar12 = true, fVar20 <= 0.0)) {
      bVar12 = fVar20 < 0.0 && uVar2 <= v_min;
      uVar14 = CONCAT71((int7)(v_max >> 8),uVar2 <= v_min);
    }
  }
  if ((bVar3 || bVar18) || bVar4) {
LAB_00266fe4:
    bVar1 = false;
  }
  else if ((0.0 <= fVar20) || (bVar1 = true, pIVar11->DragCurrentAccum <= 0.0)) {
    if (fVar20 <= 0.0) goto LAB_00266fe4;
    bVar1 = pIVar11->DragCurrentAccum < 0.0;
  }
  uVar14 = CONCAT71((int7)(uVar14 >> 8),pIVar11->ActiveIdIsJustActivated | bVar12);
  if (((pIVar11->ActiveIdIsJustActivated & 1U) != 0 || bVar12 != false) || (bVar1)) {
    pIVar11->DragCurrentAccum = 0.0;
    bVar12 = false;
  }
  else {
    if ((fVar19 == 0.0) && (!NAN(fVar19))) goto LAB_00267023;
    pIVar11->DragCurrentAccum = fVar20 + pIVar11->DragCurrentAccum;
    bVar12 = true;
  }
  pIVar11->DragCurrentAccumDirty = bVar12;
LAB_00267023:
  if (pIVar11->DragCurrentAccumDirty != true) {
    return false;
  }
  if ((bVar3 || bVar18) || bVar4) {
    data_type_00 = (int)*v + (int)(long)pIVar11->DragCurrentAccum;
    local_90 = 0.0;
  }
  else {
    auVar6._4_4_ = in_XMM4_Db;
    auVar6._0_4_ = in_XMM4_Da;
    auVar6._8_8_ = in_XMM4_Qb;
    auVar21 = vcvtusi2sd_avx512f(auVar6,*v - v_min);
    auVar7._4_4_ = in_XMM4_Db;
    auVar7._0_4_ = in_XMM4_Da;
    auVar7._8_8_ = in_XMM4_Qb;
    auVar6 = vcvtusi2sd_avx512f(auVar7,lVar17);
    local_90 = pow(auVar21._0_8_ / auVar6._0_8_,1.0 / (double)power);
    auVar8._4_4_ = in_XMM4_Db;
    auVar8._0_4_ = in_XMM4_Da;
    auVar8._8_8_ = in_XMM4_Qb;
    auVar21 = vcvtusi2ss_avx512f(auVar8,lVar17);
    dVar22 = local_90 + (double)(pIVar11->DragCurrentAccum / auVar21._0_4_);
    auVar25._0_4_ = (float)dVar22;
    auVar25._4_4_ = (int)((ulong)dVar22 >> 0x20);
    auVar25._8_8_ = 0;
    auVar21 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar25);
    auVar26._0_12_ = ZEXT812(0);
    auVar26._12_4_ = 0;
    uVar5 = vcmpss_avx512f(auVar25,auVar26,1);
    fVar19 = powf((float)((uint)!(bool)((byte)uVar5 & 1) * auVar21._0_4_),power);
    data_type_00 = (int)(long)fVar19 * (int)lVar17 + (int)v_min;
  }
  uVar14 = RoundScalarWithFormatT<unsigned_long_long,long_long>
                     ((ImGui *)format,(char *)(ulong)(uint)data_type,data_type_00,uVar14);
  pIVar11->DragCurrentAccumDirty = false;
  if ((bVar3 || bVar18) || bVar4) {
    fVar19 = (float)(long)(uVar14 - *v);
  }
  else {
    auVar9._4_4_ = in_XMM4_Db;
    auVar9._0_4_ = in_XMM4_Da;
    auVar9._8_8_ = in_XMM4_Qb;
    auVar21 = vcvtusi2sd_avx512f(auVar9,uVar14 - v_min);
    auVar10._4_4_ = in_XMM4_Db;
    auVar10._0_4_ = in_XMM4_Da;
    auVar10._8_8_ = in_XMM4_Qb;
    auVar6 = vcvtusi2sd_avx512f(auVar10,lVar17);
    dVar22 = pow(auVar21._0_8_ / auVar6._0_8_,1.0 / (double)power);
    fVar19 = (float)(dVar22 - local_90);
  }
  pIVar11->DragCurrentAccum = pIVar11->DragCurrentAccum - fVar19;
  uVar2 = *v;
  if ((v_min < v_max) && (uVar2 != uVar14)) {
    if ((uVar14 < v_min) || (((uVar15 != 8 && (uVar2 < uVar14)) && (fVar20 < 0.0)))) {
      uVar14 = v_min;
    }
    if ((v_max < uVar14) || (((uVar15 != 8 && (uVar14 < uVar2)) && (0.0 < fVar20)))) {
      uVar14 = v_max;
    }
  }
  if (uVar2 != uVar14) {
    *v = uVar14;
    return true;
  }
  return uVar2 != uVar14;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiDragFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiDragFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_clamped = (v_min < v_max);
    const bool is_power = (power != 1.0f && is_decimal && is_clamped && (v_max - v_min < FLT_MAX));
    const bool is_locked = (v_min > v_max);
    if (is_locked)
        return false;

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && g.IO.MouseDragMaxDistanceSqr[0] > 1.0f*1.0f)
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    bool is_drag_direction_change_with_power = is_power && ((adjust_delta < 0 && g.DragCurrentAccum > 0) || (adjust_delta > 0 && g.DragCurrentAccum < 0));
    if (is_just_activated || is_already_past_limits_and_pushing_outward || is_drag_direction_change_with_power)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    if (is_power)
    {
        // Offset + round to user desired precision, with a curve on the v_min..v_max range to get more precision on one side of the range
        FLOATTYPE v_old_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        FLOATTYPE v_new_norm_curved = v_old_norm_curved + (g.DragCurrentAccum / (v_max - v_min));
        v_cur = v_min + (SIGNEDTYPE)ImPow(ImSaturate((float)v_new_norm_curved), power) * (v_max - v_min);
        v_old_ref_for_accum_remainder = v_old_norm_curved;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_power)
    {
        FLOATTYPE v_cur_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        g.DragCurrentAccum -= (float)(v_cur_norm_curved - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_decimal))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_decimal))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}